

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::baggage::anon_unknown_3::TestStatsReporter::incCounter
          (TestStatsReporter *this,string *name,int64_t delta,TagMap *tags)

{
  int iVar1;
  mapped_type *pmVar2;
  string metricName;
  key_type local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    jaegertracing::metrics::Metrics::addTagsToMetricName((string *)&local_48,(unordered_map *)name);
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->_counters,&local_48);
    *pmVar2 = *pmVar2 + delta;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void incCounter(const std::string& name,
                    int64_t delta,
                    const metrics::StatsReporter::TagMap& tags) override
    {
        std::lock_guard<std::mutex> lock(_mutex);

        const auto metricName =
            metrics::Metrics::addTagsToMetricName(name, tags);
        auto& currentValue = _counters[metricName];
        currentValue = currentValue + delta;
    }